

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_gcdext(__mpz_struct *g,__mpz_struct *s,__mpz_struct *t,__mpz_struct *u,__mpz_struct *v)

{
  int iVar1;
  __mpz_struct *p_Var2;
  __mpz_struct *p_Var3;
  __mpz_struct *in_RCX;
  __mpz_struct *in_RDX;
  __mpz_struct *in_RSI;
  __mpz_struct *in_RDI;
  __mpz_struct *in_R8;
  int c;
  mp_bitcnt_t shift;
  mp_bitcnt_t __mp_bitcnt_t_swap__tmp;
  mpz_ptr __mpz_ptr_swap__tmp;
  mpz_srcptr __mpz_srcptr_swap__tmp;
  long sign_1;
  long sign;
  mp_bitcnt_t power;
  mp_bitcnt_t gz;
  mp_bitcnt_t vz;
  mp_bitcnt_t uz;
  mpz_t t1;
  mpz_t t0;
  mpz_t s1;
  mpz_t s0;
  mpz_t tv;
  mpz_t tu;
  __mpz_struct *in_stack_ffffffffffffff18;
  __mpz_struct *d;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  __mpz_struct *in_stack_ffffffffffffff28;
  __mpz_struct *in_stack_ffffffffffffff30;
  __mpz_struct *in_stack_ffffffffffffff38;
  __mpz_struct *in_stack_ffffffffffffff40;
  long local_a8;
  __mpz_struct *bits;
  __mpz_struct *u_00;
  __mpz_struct *r;
  __mpz_struct local_88;
  __mpz_struct local_78;
  __mpz_struct local_68;
  __mpz_struct local_58;
  __mpz_struct local_48;
  __mpz_struct local_38;
  __mpz_struct *local_28;
  __mpz_struct *local_20;
  __mpz_struct *local_18;
  __mpz_struct *local_10;
  __mpz_struct *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RCX->_mp_size == 0) {
    mpz_sgn(in_R8);
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18);
    if (local_10 != (__mpz_struct *)0x0) {
      local_10->_mp_size = 0;
    }
    if (local_18 != (__mpz_struct *)0x0) {
      mpz_set_si(in_stack_ffffffffffffff30,(long)in_stack_ffffffffffffff28);
    }
  }
  else if (in_R8->_mp_size == 0) {
    mpz_sgn(in_RCX);
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18);
    if (local_10 != (__mpz_struct *)0x0) {
      mpz_set_si(in_stack_ffffffffffffff30,(long)in_stack_ffffffffffffff28);
    }
    if (local_18 != (__mpz_struct *)0x0) {
      local_18->_mp_size = 0;
    }
  }
  else {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_8 = in_RDI;
    mpz_init(&local_38);
    mpz_init(&local_48);
    mpz_init(&local_58);
    mpz_init(&local_68);
    mpz_init(&local_78);
    mpz_init(&local_88);
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18);
    p_Var2 = (__mpz_struct *)
             mpz_make_odd((__mpz_struct *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff18);
    p_Var3 = (__mpz_struct *)
             mpz_make_odd((__mpz_struct *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    d = p_Var3;
    if (p_Var2 < p_Var3) {
      d = p_Var2;
    }
    p_Var3 = (__mpz_struct *)((long)p_Var3 - (long)d);
    bits = d;
    u_00 = p_Var3;
    r = (__mpz_struct *)((long)p_Var2 - (long)d);
    if (local_38._mp_size < local_48._mp_size) {
      in_stack_ffffffffffffff30 = (__mpz_struct *)((long)p_Var2 - (long)d);
      mpz_swap(&local_38,&local_48);
      in_stack_ffffffffffffff38 = local_10;
      in_stack_ffffffffffffff40 = local_20;
      local_20 = local_28;
      local_28 = in_stack_ffffffffffffff40;
      local_10 = local_18;
      local_18 = in_stack_ffffffffffffff38;
      u_00 = in_stack_ffffffffffffff30;
      r = p_Var3;
    }
    mpz_tdiv_qr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
    mpz_setbit((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (mp_bitcnt_t)d);
    local_a8 = (long)&u_00->_mp_alloc + (long)&r->_mp_alloc;
    if (local_38._mp_size < 1) {
      mpz_setbit((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (mp_bitcnt_t)d);
    }
    else {
      in_stack_ffffffffffffff28 =
           (__mpz_struct *)
           mpz_make_odd((__mpz_struct *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      mpz_setbit((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (mp_bitcnt_t)d);
      local_a8 = (long)&in_stack_ffffffffffffff28->_mp_alloc + local_a8;
      while (in_stack_ffffffffffffff24 =
                  mpz_cmp(in_stack_ffffffffffffff28,
                          (__mpz_struct *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
            in_stack_ffffffffffffff24 != 0) {
        if (in_stack_ffffffffffffff24 < 0) {
          mpz_sub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          in_stack_ffffffffffffff28 =
               (__mpz_struct *)
               mpz_make_odd((__mpz_struct *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
          mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
        }
        else {
          mpz_sub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          in_stack_ffffffffffffff28 =
               (__mpz_struct *)
               mpz_make_odd((__mpz_struct *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
          mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
        }
        local_a8 = (long)&in_stack_ffffffffffffff28->_mp_alloc + local_a8;
      }
      in_stack_ffffffffffffff24 = 0;
    }
    mpz_mul_2exp(r,u_00,(mp_bitcnt_t)bits);
    mpz_neg((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    mpz_divexact(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    mpz_divexact(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    mpz_abs((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    while (local_a8 != 0) {
      if ((((uint)(local_58._mp_size != 0) & (uint)*local_58._mp_d) != 0) ||
         (((uint)(local_78._mp_size != 0) & (uint)*local_78._mp_d) != 0)) {
        mpz_sub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      mpz_tdiv_q_2exp((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      d,0x9aa2d7);
      mpz_tdiv_q_2exp((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      d,0x9aa2eb);
      local_a8 = local_a8 + -1;
    }
    mpz_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
            (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    iVar1 = mpz_cmpabs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (0 < iVar1) {
      mpz_swap(&local_58,&local_68);
      mpz_sub(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
              (__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    if (local_20->_mp_size < 0) {
      mpz_neg((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    }
    if (local_28->_mp_size < 0) {
      mpz_neg((__mpz_struct *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),d);
    }
    mpz_swap(local_8,&local_48);
    if (local_10 != (__mpz_struct *)0x0) {
      mpz_swap(local_10,&local_58);
    }
    if (local_18 != (__mpz_struct *)0x0) {
      mpz_swap(local_18,&local_78);
    }
    mpz_clear((__mpz_struct *)0x9aa3ef);
    mpz_clear((__mpz_struct *)0x9aa3fc);
    mpz_clear((__mpz_struct *)0x9aa409);
    mpz_clear((__mpz_struct *)0x9aa416);
    mpz_clear((__mpz_struct *)0x9aa420);
    mpz_clear((__mpz_struct *)0x9aa42a);
  }
  return;
}

Assistant:

void
mpz_gcdext (mpz_t g, mpz_t s, mpz_t t, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv, s0, s1, t0, t1;
  mp_bitcnt_t uz, vz, gz;
  mp_bitcnt_t power;

  if (u->_mp_size == 0)
    {
      /* g = 0 u + sgn(v) v */
      signed long sign = mpz_sgn (v);
      mpz_abs (g, v);
      if (s)
	s->_mp_size = 0;
      if (t)
	mpz_set_si (t, sign);
      return;
    }

  if (v->_mp_size == 0)
    {
      /* g = sgn(u) u + 0 v */
      signed long sign = mpz_sgn (u);
      mpz_abs (g, u);
      if (s)
	mpz_set_si (s, sign);
      if (t)
	t->_mp_size = 0;
      return;
    }

  mpz_init (tu);
  mpz_init (tv);
  mpz_init (s0);
  mpz_init (s1);
  mpz_init (t0);
  mpz_init (t1);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  uz -= gz;
  vz -= gz;

  /* Cofactors corresponding to odd gcd. gz handled later. */
  if (tu->_mp_size < tv->_mp_size)
    {
      mpz_swap (tu, tv);
      MPZ_SRCPTR_SWAP (u, v);
      MPZ_PTR_SWAP (s, t);
      MP_BITCNT_T_SWAP (uz, vz);
    }

  /* Maintain
   *
   * u = t0 tu + t1 tv
   * v = s0 tu + s1 tv
   *
   * where u and v denote the inputs with common factors of two
   * eliminated, and det (s0, t0; s1, t1) = 2^p. Then
   *
   * 2^p tu =  s1 u - t1 v
   * 2^p tv = -s0 u + t0 v
   */

  /* After initial division, tu = q tv + tu', we have
   *
   * u = 2^uz (tu' + q tv)
   * v = 2^vz tv
   *
   * or
   *
   * t0 = 2^uz, t1 = 2^uz q
   * s0 = 0,    s1 = 2^vz
   */

  mpz_tdiv_qr (t1, tu, tu, tv);
  mpz_mul_2exp (t1, t1, uz);

  mpz_setbit (s1, vz);
  power = uz + vz;

  if (tu->_mp_size > 0)
    {
      mp_bitcnt_t shift;
      shift = mpz_make_odd (tu);
      mpz_setbit (t0, uz + shift);
      power += shift;

      for (;;)
	{
	  int c;
	  c = mpz_cmp (tu, tv);
	  if (c == 0)
	    break;

	  if (c < 0)
	    {
	      /* tv = tv' + tu
	       *
	       * u = t0 tu + t1 (tv' + tu) = (t0 + t1) tu + t1 tv'
	       * v = s0 tu + s1 (tv' + tu) = (s0 + s1) tu + s1 tv' */

	      mpz_sub (tv, tv, tu);
	      mpz_add (t0, t0, t1);
	      mpz_add (s0, s0, s1);

	      shift = mpz_make_odd (tv);
	      mpz_mul_2exp (t1, t1, shift);
	      mpz_mul_2exp (s1, s1, shift);
	    }
	  else
	    {
	      mpz_sub (tu, tu, tv);
	      mpz_add (t1, t0, t1);
	      mpz_add (s1, s0, s1);

	      shift = mpz_make_odd (tu);
	      mpz_mul_2exp (t0, t0, shift);
	      mpz_mul_2exp (s0, s0, shift);
	    }
	  power += shift;
	}
    }
  else
    mpz_setbit (t0, uz);

  /* Now tv = odd part of gcd, and -s0 and t0 are corresponding
     cofactors. */

  mpz_mul_2exp (tv, tv, gz);
  mpz_neg (s0, s0);

  /* 2^p g = s0 u + t0 v. Eliminate one factor of two at a time. To
     adjust cofactors, we need u / g and v / g */

  mpz_divexact (s1, v, tv);
  mpz_abs (s1, s1);
  mpz_divexact (t1, u, tv);
  mpz_abs (t1, t1);

  while (power-- > 0)
    {
      /* s0 u + t0 v = (s0 - v/g) u - (t0 + u/g) v */
      if (mpz_odd_p (s0) || mpz_odd_p (t0))
	{
	  mpz_sub (s0, s0, s1);
	  mpz_add (t0, t0, t1);
	}
      assert (mpz_even_p (t0) && mpz_even_p (s0));
      mpz_tdiv_q_2exp (s0, s0, 1);
      mpz_tdiv_q_2exp (t0, t0, 1);
    }

  /* Arrange so that |s| < |u| / 2g */
  mpz_add (s1, s0, s1);
  if (mpz_cmpabs (s0, s1) > 0)
    {
      mpz_swap (s0, s1);
      mpz_sub (t0, t0, t1);
    }
  if (u->_mp_size < 0)
    mpz_neg (s0, s0);
  if (v->_mp_size < 0)
    mpz_neg (t0, t0);

  mpz_swap (g, tv);
  if (s)
    mpz_swap (s, s0);
  if (t)
    mpz_swap (t, t0);

  mpz_clear (tu);
  mpz_clear (tv);
  mpz_clear (s0);
  mpz_clear (s1);
  mpz_clear (t0);
  mpz_clear (t1);
}